

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

bool google::protobuf::compiler::ruby::GenerateFile
               (FileDescriptor *file,Printer *printer,string *error)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  FileDescriptor *import;
  Descriptor *pDVar5;
  EnumDescriptor *pEVar6;
  allocator<char> local_b1;
  string local_b0;
  int local_90;
  allocator<char> local_89;
  int i_4;
  int local_68;
  int i_3;
  string local_58;
  int local_38;
  int local_34;
  int levels;
  int i_2;
  int i_1;
  int i;
  string *error_local;
  Printer *printer_local;
  FileDescriptor *file_local;
  
  _i_1 = error;
  error_local = (string *)printer;
  printer_local = (Printer *)file;
  psVar4 = FileDescriptor::name_abi_cxx11_(file);
  io::Printer::Print(printer,
                     "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\n"
                     ,"filename",psVar4);
  io::Printer::Print((Printer *)error_local,"require \'google/protobuf\'\n\n");
  i_2 = 0;
  while( true ) {
    iVar3 = i_2;
    iVar2 = FileDescriptor::dependency_count((FileDescriptor *)printer_local);
    if (iVar2 <= iVar3) {
      io::Printer::Print((Printer *)error_local,
                         "Google::Protobuf::DescriptorPool.generated_pool.build do\n");
      io::Printer::Indent((Printer *)error_local);
      for (levels = 0; iVar3 = levels,
          iVar2 = FileDescriptor::message_type_count((FileDescriptor *)printer_local), iVar3 < iVar2
          ; levels = levels + 1) {
        pDVar5 = FileDescriptor::message_type((FileDescriptor *)printer_local,levels);
        GenerateMessage(pDVar5,(Printer *)error_local);
      }
      for (local_34 = 0; iVar3 = local_34,
          iVar2 = FileDescriptor::enum_type_count((FileDescriptor *)printer_local), iVar3 < iVar2;
          local_34 = local_34 + 1) {
        pEVar6 = FileDescriptor::enum_type((FileDescriptor *)printer_local,local_34);
        GenerateEnum(pEVar6,(Printer *)error_local);
      }
      io::Printer::Outdent((Printer *)error_local);
      io::Printer::Print((Printer *)error_local,"end\n\n");
      psVar4 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)printer_local);
      std::__cxx11::string::string((string *)&local_58,(string *)psVar4);
      iVar3 = GeneratePackageModules(&local_58,(Printer *)error_local);
      std::__cxx11::string::~string((string *)&local_58);
      local_38 = iVar3;
      for (local_68 = 0; iVar3 = local_68,
          iVar2 = FileDescriptor::message_type_count((FileDescriptor *)printer_local), iVar3 < iVar2
          ; local_68 = local_68 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&i_4,"",&local_89);
        pDVar5 = FileDescriptor::message_type((FileDescriptor *)printer_local,local_68);
        GenerateMessageAssignment((string *)&i_4,pDVar5,(Printer *)error_local);
        std::__cxx11::string::~string((string *)&i_4);
        std::allocator<char>::~allocator(&local_89);
      }
      for (local_90 = 0; iVar3 = local_90,
          iVar2 = FileDescriptor::enum_type_count((FileDescriptor *)printer_local), iVar3 < iVar2;
          local_90 = local_90 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
        pEVar6 = FileDescriptor::enum_type((FileDescriptor *)printer_local,local_90);
        GenerateEnumAssignment(&local_b0,pEVar6,(Printer *)error_local);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
      EndPackageModules(local_38,(Printer *)error_local);
      return true;
    }
    import = FileDescriptor::dependency((FileDescriptor *)printer_local,i_2);
    bVar1 = MaybeEmitDependency(import,(FileDescriptor *)printer_local,(Printer *)error_local,_i_1);
    if (!bVar1) break;
    i_2 = i_2 + 1;
  }
  return false;
}

Assistant:

bool GenerateFile(const FileDescriptor* file, io::Printer* printer,
                  string* error) {
  printer->Print(
    "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "# source: $filename$\n"
    "\n",
    "filename", file->name());

  printer->Print(
    "require 'google/protobuf'\n\n");

  for (int i = 0; i < file->dependency_count(); i++) {
    if (!MaybeEmitDependency(file->dependency(i), file, printer, error)) {
      return false;
    }
  }

  printer->Print(
    "Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  printer->Indent();
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessage(file->message_type(i), printer);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(file->enum_type(i), printer);
  }
  printer->Outdent();
  printer->Print(
    "end\n\n");

  int levels = GeneratePackageModules(file->package(), printer);
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessageAssignment("", file->message_type(i), printer);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnumAssignment("", file->enum_type(i), printer);
  }
  EndPackageModules(levels, printer);
  return true;
}